

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O0

string * __thiscall
duckdb::PhysicalOperator::ToString_abi_cxx11_(PhysicalOperator *this,ExplainFormat format)

{
  ostream *ss_00;
  string *in_RDI;
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> tree;
  stringstream ss;
  unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true> renderer;
  PhysicalOperator *in_stack_fffffffffffffe18;
  unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>
  *in_stack_fffffffffffffe20;
  string *this_00;
  stringstream local_1a8 [103];
  ExplainFormat in_stack_fffffffffffffebf;
  
  this_00 = in_RDI;
  TreeRenderer::CreateRenderer(in_stack_fffffffffffffebf);
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  RenderTree::CreateRenderTree(in_stack_fffffffffffffe18);
  ss_00 = (ostream *)
          unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>::
          operator->(in_stack_fffffffffffffe20);
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
            ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *)ss_00)
  ;
  TreeRenderer::ToStream((TreeRenderer *)this_00,(RenderTree *)in_RDI,ss_00);
  ::std::__cxx11::stringstream::str();
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::~unique_ptr
            ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *)
             0x79f070);
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>::~unique_ptr
            ((unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true> *)
             0x79f087);
  return this_00;
}

Assistant:

string PhysicalOperator::ToString(ExplainFormat format) const {
	auto renderer = TreeRenderer::CreateRenderer(format);
	stringstream ss;
	auto tree = RenderTree::CreateRenderTree(*this);
	renderer->ToStream(*tree, ss);
	return ss.str();
}